

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_> *
__thiscall
cfd::core::
JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>::
ConvertToStruct(JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                *this)

{
  bool bVar1;
  vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_> *in_RSI;
  DecodeRawTransactionTxOutStruct *in_RDI;
  DecodeRawTransactionTxOutStruct data;
  DecodeRawTransactionTxOut *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  *__range3;
  vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_> *result;
  vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  *in_stack_fffffffffffffea8;
  DecodeRawTransactionTxOutStruct *__x;
  DecodeRawTransactionTxOut *in_stack_ffffffffffffff88;
  __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>::
  vector((vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
          *)0x6b50ee);
  local_28[0]._M_current =
       (DecodeRawTransactionTxOut *)
       ::std::
       vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
       ::begin(in_stack_fffffffffffffea8);
  ::std::
  vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  ::end(in_stack_fffffffffffffea8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::DecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::DecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>_>
                             *)in_stack_fffffffffffffea8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>_>
    ::operator*(local_28);
    cfd::api::json::DecodeRawTransactionTxOut::ConvertToStruct(in_stack_ffffffffffffff88);
    ::std::vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
    ::push_back(in_RSI,__x);
    DecodeRawTransactionTxOutStruct::~DecodeRawTransactionTxOutStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodeRawTransactionTxOut_*,_std::vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>_>
    ::operator++(local_28);
  }
  return (vector<DecodeRawTransactionTxOutStruct,_std::allocator<DecodeRawTransactionTxOutStruct>_>
          *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }